

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

void HUF_simpleQuickSort(nodeElt *arr,int low,int high)

{
  uint uVar1;
  nodeElt nVar2;
  bool bVar3;
  nodeElt *pnVar4;
  U16 UVar5;
  BYTE BVar6;
  BYTE BVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  
  iVar8 = high - low;
  if (iVar8 < 8) {
    if (0 < iVar8) {
      uVar10 = 1;
      do {
        uVar1 = arr[(long)low + uVar10].count;
        pnVar4 = arr + (long)low + uVar10;
        UVar5 = pnVar4->parent;
        BVar6 = pnVar4->byte;
        BVar7 = pnVar4->nbBits;
        uVar12 = uVar10;
        do {
          uVar13 = uVar12 - 1 & 0xffffffff;
          if (uVar1 <= arr[(long)low + uVar13].count) goto LAB_007266f4;
          arr[(long)low + uVar12] = arr[(long)low + uVar13];
          bVar3 = 1 < (long)uVar12;
          uVar12 = uVar12 - 1;
        } while (bVar3);
        uVar12 = 0;
LAB_007266f4:
        arr[(long)low + (long)(int)uVar12].count = uVar1;
        pnVar4 = arr + (long)low + (long)(int)uVar12;
        pnVar4->parent = UVar5;
        pnVar4->byte = BVar6;
        pnVar4->nbBits = BVar7;
        uVar10 = uVar10 + 1;
      } while (uVar10 != iVar8 + 1);
    }
  }
  else if (low < high) {
    do {
      lVar9 = (long)high;
      uVar1 = arr[lVar9].count;
      iVar8 = low + -1;
      lVar11 = (long)low;
      do {
        if (uVar1 < arr[lVar11].count) {
          nVar2 = arr[(long)iVar8 + 1];
          arr[(long)iVar8 + 1] = arr[lVar11];
          arr[lVar11] = nVar2;
          iVar8 = iVar8 + 1;
        }
        lVar11 = lVar11 + 1;
      } while (lVar9 != lVar11);
      nVar2 = arr[(long)iVar8 + 1];
      arr[(long)iVar8 + 1] = arr[lVar9];
      arr[lVar9] = nVar2;
      if ((iVar8 + 1) - low < high - (iVar8 + 1)) {
        HUF_simpleQuickSort(arr,low,iVar8);
        low = iVar8 + 2;
      }
      else {
        HUF_simpleQuickSort(arr,iVar8 + 2,high);
        high = iVar8;
      }
    } while (low < high);
  }
  return;
}

Assistant:

static void HUF_simpleQuickSort(nodeElt arr[], int low, int high) {
    int const kInsertionSortThreshold = 8;
    if (high - low < kInsertionSortThreshold) {
        HUF_insertionSort(arr, low, high);
        return;
    }
    while (low < high) {
        int const idx = HUF_quickSortPartition(arr, low, high);
        if (idx - low < high - idx) {
            HUF_simpleQuickSort(arr, low, idx - 1);
            low = idx + 1;
        } else {
            HUF_simpleQuickSort(arr, idx + 1, high);
            high = idx - 1;
        }
    }
}